

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall
QGraphicsAnchorLayoutPrivate::findPaths(QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  AnchorVertex **ppAVar1;
  bool bVar2;
  long lVar3;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath> *this_00;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath> *value;
  long lVar4;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_01;
  long in_FS_OFFSET;
  AnchorData *edge;
  AnchorVertex *root;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> local_e8;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> local_d8;
  undefined1 local_b8 [24];
  AnchorData *local_a0;
  value_type local_98;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> local_88;
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>
  local_68;
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> local_60;
  QArrayDataPointer<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
  local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = 0;
  local_60.d = (Data *)0x0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                  *)0x0;
  this_01 = (this->graph).m_data + (long)(int)orientation + -1;
  local_68.d = (this->graph).m_data[(long)(int)orientation + 1].m_graph.d;
  this_00 = (QMultiHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath> *)
            ((this->graphPaths).m_data + (long)(int)orientation + -1);
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (AnchorVertex **)0x0;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>::
  emplace<QtGraphicsAnchorLayout::GraphPath_const&>
            ((iterator *)&local_88,this_00,(AnchorVertex **)&local_68,(GraphPath *)&local_d8);
  QtGraphicsAnchorLayout::GraphPath::~GraphPath((GraphPath *)&local_d8);
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::adjacentVertices
            ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_88,this_01,
             (AnchorVertex *)local_68.d);
  ppAVar1 = local_88.ptr;
  lVar4 = local_88.size << 3;
  for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 8) {
    local_d8.ptr = *(AnchorVertex ***)((long)ppAVar1 + lVar3);
    local_d8.d = (Data *)local_68.d;
    QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>::
    emplaceBack<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>const&>
              ((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
                *)&local_58,
               (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                *)&local_d8);
  }
  while( true ) {
    if (local_58.size == 0) break;
    local_98.second = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.first = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
               ::takeFirst((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                            *)&local_58);
    local_a0 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
               edgeData(this_01,local_98.first,local_98.second);
    bVar2 = QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::contains
                      (&local_60,&local_a0);
    if (!bVar2) {
      QSet<QtGraphicsAnchorLayout::AnchorData_*>::insert
                ((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)&local_d8,(AnchorData **)&local_60);
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::value
                ((QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
                  *)local_b8,(AnchorVertex **)this_00);
      value = (QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
               *)local_b8;
      if (local_a0->from != local_98.first) {
        value = (QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
                 *)(local_b8 + 8);
      }
      QSet<QtGraphicsAnchorLayout::AnchorData_*>::insert
                ((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)&local_d8,(AnchorData **)value);
      QMultiHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::GraphPath>::
      emplace<QtGraphicsAnchorLayout::GraphPath_const&>
                ((iterator *)&local_d8,this_00,&local_98.second,(GraphPath *)local_b8);
      local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
      Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
      adjacentVertices((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_d8,this_01,
                       local_98.second);
      ppAVar1 = local_d8.ptr;
      lVar3 = local_d8.size << 3;
      for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 8) {
        local_e8.second = *(AnchorVertex **)((long)ppAVar1 + lVar4);
        local_e8.first = local_98.second;
        QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
        ::
        emplaceBack<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>const&>
                  ((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
                    *)&local_58,&local_e8);
      }
      QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_d8);
      QtGraphicsAnchorLayout::GraphPath::~GraphPath((GraphPath *)local_b8);
    }
  }
  identifyFloatItems(this,(QSet<QtGraphicsAnchorLayout::AnchorData_*> *)&local_60,orientation);
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_88);
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash(&local_60);
  QArrayDataPointer<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
  ::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::findPaths(Qt::Orientation orientation)
{
    QQueue<std::pair<AnchorVertex *, AnchorVertex *> > queue;

    QSet<AnchorData *> visited;

    AnchorVertex *root = layoutFirstVertex[orientation];

    graphPaths[orientation].insert(root, GraphPath());

    const auto adjacentVertices = graph[orientation].adjacentVertices(root);
    for (AnchorVertex *v : adjacentVertices)
        queue.enqueue(std::pair(root, v));

    while(!queue.isEmpty()) {
        std::pair<AnchorVertex *, AnchorVertex *>  pair = queue.dequeue();
        AnchorData *edge = graph[orientation].edgeData(pair.first, pair.second);

        if (visited.contains(edge))
            continue;

        visited.insert(edge);
        GraphPath current = graphPaths[orientation].value(pair.first);

        if (edge->from == pair.first)
            current.positives.insert(edge);
        else
            current.negatives.insert(edge);

        graphPaths[orientation].insert(pair.second, current);

        const auto adjacentVertices = graph[orientation].adjacentVertices(pair.second);
        for (AnchorVertex *v : adjacentVertices)
            queue.enqueue(std::pair(pair.second, v));
    }

    // We will walk through every reachable items (non-float) store them in a temporary set.
    // We them create a set of all items and subtract the non-floating items from the set in
    // order to get the floating items. The floating items is then stored in m_floatItems
    identifyFloatItems(visited, orientation);
}